

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O3

void Aig_RManPrintSigs(Aig_VSig_t *pSigs,int nVars)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  int *local_40;
  
  if (0 < nVars) {
    local_40 = pSigs->nCofOnes;
    uVar4 = 0;
    do {
      printf("%2d : ",uVar4 & 0xffffffff);
      lVar2 = 0;
      bVar1 = true;
      do {
        bVar5 = bVar1;
        printf("%5d  ",(ulong)(uint)pSigs[uVar4 * 2 + lVar2].nOnes);
        putchar(0x28);
        uVar3 = 0;
        do {
          printf("%4d ",(ulong)(uint)local_40[lVar2 * 0xd + uVar3]);
          uVar3 = uVar3 + 1;
        } while ((uint)nVars != uVar3);
        printf(")  ");
        lVar2 = 1;
        bVar1 = false;
      } while (bVar5);
      putchar(10);
      uVar4 = uVar4 + 1;
      local_40 = local_40 + 0x1a;
    } while (uVar4 != (uint)nVars);
  }
  return;
}

Assistant:

void Aig_RManPrintSigs( Aig_VSig_t * pSigs, int nVars )
{
    int v, i, k;
    for ( v = 0; v < nVars; v++ )
    {
        printf( "%2d : ", v );
        for ( k = 0; k < 2; k++ )
        {
            printf( "%5d  ", pSigs[2*v+k].nOnes );
            printf( "(" );
            for ( i = 0; i < nVars; i++ )
                printf( "%4d ", pSigs[2*v+k].nCofOnes[i] );
            printf( ")  " );
        }
        printf( "\n" );
    }
}